

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCFifoUnix.cpp
# Opt level: O1

bool __thiscall gnilk::IPCFifoUnix::Available(IPCFifoUnix *this)

{
  int iVar1;
  pollfd pfd;
  pollfd local_8;
  
  local_8.events = 1;
  local_8.revents = 0;
  local_8.fd = this->rwfd;
  iVar1 = poll(&local_8,1,0);
  return iVar1 == 1;
}

Assistant:

bool IPCFifoUnix::Available() {
    struct pollfd pfd {
            .fd = rwfd,
            .events = POLLIN,
            .revents = {},
    };

    // Non-blocking poll...
    if (poll(&pfd, 1, 0)==1) {
        return true;
    }
    return false;
}